

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O3

void Res_SimDeriveInfoReplicate(Res_Sim_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  void *pvVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  
  pVVar2 = p->pAig->vPos;
  iVar10 = pVVar2->nSize;
  if (0 < iVar10) {
    ppvVar3 = pVVar2->pArray;
    pVVar4 = p->vPats;
    lVar8 = 0;
    do {
      iVar1 = *(int *)((long)ppvVar3[lVar8] + 0x10);
      if ((((long)iVar1 < 0) || (pVVar4->nSize <= iVar1)) || (p->vOuts->nSize <= lVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar6 = p->nPats;
      if (0 < iVar6) {
        pvVar5 = pVVar4->pArray[iVar1];
        pvVar9 = p->vOuts->pArray[lVar8];
        uVar11 = (ulong)(uint)p->nWords;
        iVar10 = 0;
        do {
          if (0 < (int)uVar11) {
            lVar12 = 0;
            lVar7 = 0;
            do {
              *(undefined4 *)((long)pvVar9 + lVar7 * 4) = *(undefined4 *)((long)pvVar5 + lVar7 * 4);
              lVar7 = lVar7 + 1;
              uVar11 = (ulong)p->nWords;
              lVar12 = lVar12 + 4;
            } while (lVar7 < (long)uVar11);
            iVar6 = p->nPats;
            pvVar9 = (void *)((long)pvVar9 + lVar12);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < iVar6);
        iVar10 = pVVar2->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar10);
  }
  return;
}

Assistant:

void Res_SimDeriveInfoReplicate( Res_Sim_t * p )
{
    unsigned * pInfo, * pInfo2;
    Abc_Obj_t * pObj;
    int i, j, w;
    Abc_NtkForEachPo( p->pAig, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( p->vPats, pObj->Id );
        pInfo2 = (unsigned *)Vec_PtrEntry( p->vOuts, i );
        for ( j = 0; j < p->nPats; j++ )
            for ( w = 0; w < p->nWords; w++ )
                *pInfo2++ = pInfo[w];
    }
}